

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

bool __thiscall
wasm::OptimizeInstructions::trapOnNull(OptimizeInstructions *this,Expression *curr,Expression **ref)

{
  ulong uVar1;
  PassRunner *pPVar2;
  size_t sVar3;
  bool bVar4;
  Id IVar5;
  Index IVar6;
  Drop *pDVar7;
  HeapType HVar8;
  Expression **ppEVar9;
  Expression *pEVar10;
  Block *pBVar11;
  Drop *this_00;
  Expression ***pppEVar12;
  Module *pMVar13;
  Builder *pBVar14;
  Index IVar15;
  byte bVar16;
  Expression *pEVar17;
  Builder BVar18;
  Type *this_01;
  Index index;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  AbstractChildIterator<wasm::ChildIterator> local_1f0;
  EffectAnalyzer local_1b0;
  Drop *local_50;
  Builder local_48;
  Builder builder;
  
  local_48.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  local_50 = (Drop *)curr;
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).trapsNeverHappen != true) goto LAB_009e5f83;
  pEVar10 = *ref;
  IVar5 = pEVar10->_id;
  pEVar17 = pEVar10;
  if (IVar5 == IfId) {
    if (*(long *)(pEVar10 + 2) == 0) {
LAB_009e5dff:
      IVar5 = pEVar17->_id;
      goto LAB_009e5e03;
    }
    pEVar17 = (Expression *)pEVar10[1].type.id;
    bVar4 = wasm::Type::isNull(&pEVar17->type);
    if (!bVar4) {
LAB_009e5ce5:
      pEVar17 = *(Expression **)(pEVar10 + 2);
      bVar4 = wasm::Type::isNull(&pEVar17->type);
      if (bVar4) {
        EffectAnalyzer::EffectAnalyzer
                  (&local_1b0,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,pEVar17);
        if ((local_1b0.branchesOut == false) && (bVar4 = false, local_1b0.throws_ == false)) {
          if (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
            bVar4 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
          }
        }
        else {
          bVar4 = false;
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)((long)&local_1b0 + 0x130));
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)((long)&local_1b0 + 0x100));
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)((long)&local_1b0 + 0xa8));
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)((long)&local_1b0 + 0x78));
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)((long)&local_1b0 + 0x48));
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)((long)&local_1b0 + 0x18));
        pEVar17 = *ref;
        if (bVar4) {
          pMVar13 = (Module *)pEVar10[1].type.id;
          if ((pointer)(pEVar17->type).id !=
              (pMVar13->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            this->refinalize = true;
          }
          pEVar17 = *(Expression **)(pEVar10 + 1);
          pDVar7 = (Drop *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
          (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId
          ;
          (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
          pDVar7->value = pEVar17;
          Drop::finalize(pDVar7);
          pEVar10 = (Expression *)pEVar10[1].type.id;
          goto LAB_009e62b9;
        }
      }
      else {
        pEVar17 = *ref;
      }
      goto LAB_009e5dff;
    }
    EffectAnalyzer::EffectAnalyzer
              (&local_1b0,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,pEVar17);
    if ((local_1b0.branchesOut == false) && (bVar4 = false, local_1b0.throws_ == false)) {
      if (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar4 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      }
    }
    else {
      bVar4 = false;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x130));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x100));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0xa8));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x78));
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)((long)&local_1b0 + 0x48));
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)((long)&local_1b0 + 0x18));
    if (!bVar4) goto LAB_009e5ce5;
    pMVar13 = *(Module **)(pEVar10 + 2);
    if ((pointer)((*ref)->type).id !=
        (pMVar13->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this->refinalize = true;
    }
    pEVar17 = *(Expression **)(pEVar10 + 1);
    pDVar7 = (Drop *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar7->value = pEVar17;
    Drop::finalize(pDVar7);
    pEVar10 = *(Expression **)(pEVar10 + 2);
LAB_009e62b9:
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pMVar13;
    pBVar11 = Builder::makeSequence(&local_48,(Expression *)pDVar7,pEVar10,type);
LAB_009e62c1:
    *ref = (Expression *)pBVar11;
    return false;
  }
LAB_009e5e03:
  if (IVar5 != SelectId) goto LAB_009e5f83;
  pEVar10 = *(Expression **)(pEVar17 + 1);
  bVar4 = wasm::Type::isNull(&pEVar10->type);
  if (bVar4) {
    EffectAnalyzer::EffectAnalyzer
              (&local_1b0,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,pEVar10);
    if ((local_1b0.branchesOut == false) && (bVar4 = false, local_1b0.throws_ == false)) {
      if (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar4 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      }
    }
    else {
      bVar4 = false;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x130));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x100));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0xa8));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x78));
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)((long)&local_1b0 + 0x48));
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)((long)&local_1b0 + 0x18));
    if ((bVar4) && (*(long *)(pEVar17[1].type.id + 8) != 1)) {
      pEVar10 = *(Expression **)(pEVar17 + 1);
      local_50 = (Drop *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      (local_50->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (local_50->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      local_50->value = pEVar10;
      Drop::finalize(local_50);
      builder.wasm = (Module *)pEVar17[1].type.id;
      pEVar10 = *(Expression **)(pEVar17 + 2);
      pDVar7 = (Drop *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar7->value = pEVar10;
      Drop::finalize(pDVar7);
      pMVar13 = (this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .
                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .currModule;
      pEVar10 = getResultOfFirst((Expression *)builder.wasm,(Expression *)pDVar7,
                                 (this->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                 .
                                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                 .currFunction,pMVar13,
                                 &((this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).super_Pass.runner)->options);
      pDVar7 = local_50;
      goto LAB_009e62b9;
    }
  }
  pEVar10 = (Expression *)pEVar17[1].type.id;
  bVar4 = wasm::Type::isNull(&pEVar10->type);
  if (bVar4) {
    EffectAnalyzer::EffectAnalyzer
              (&local_1b0,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,pEVar10);
    if ((local_1b0.branchesOut == false) && (bVar4 = false, local_1b0.throws_ == false)) {
      if (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar4 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      }
    }
    else {
      bVar4 = false;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x130));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x100));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0xa8));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&local_1b0 + 0x78));
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)((long)&local_1b0 + 0x48));
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)((long)&local_1b0 + 0x18));
    if ((bVar4) && (((*(Expression **)(pEVar17 + 1))->type).id != 1)) {
      builder.wasm = (Module *)pEVar17[1].type.id;
      pBVar14 = &local_48;
      local_50 = (Drop *)*(Expression **)(pEVar17 + 1);
      pDVar7 = (Drop *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar7->value = (Expression *)builder.wasm;
      Drop::finalize(pDVar7);
      builder.wasm = *(Module **)(pEVar17 + 2);
      this_00 = (Drop *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_00->value = (Expression *)builder.wasm;
      Drop::finalize(this_00);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pBVar14;
      pBVar11 = Builder::makeSequence(&local_48,(Expression *)pDVar7,(Expression *)this_00,type_00);
      pBVar11 = (Block *)getResultOfFirst((Expression *)local_50,(Expression *)pBVar11,
                                          (this->
                                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .
                                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .currFunction,
                                          (this->
                                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .
                                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .currModule,
                                          &((this->
                                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                            ).super_Pass.runner)->options);
      goto LAB_009e62c1;
    }
  }
LAB_009e5f83:
  BVar18.wasm = (Module *)*ref;
  uVar1 = ((Type *)&((BVar18.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->id;
  if ((((uint)uVar1 & 3) == 2 && 6 < uVar1) &&
     (*(Id *)&((BVar18.wasm)->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == RefCastId)) {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              (&local_1f0,(Expression *)local_50);
    IVar15 = (int)((ulong)((long)local_1f0.children.flexible.
                                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1f0.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) +
             (int)local_1f0.children.usedFixed;
    if (IVar15 != 0) {
      bVar16 = 0;
      index = 0;
      builder.wasm = BVar18.wasm;
      do {
        IVar6 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_1f0,index);
        pppEVar12 = local_1f0.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar6 - 4);
        if (IVar6 < 4) {
          pppEVar12 = local_1f0.children.fixed._M_elems + IVar6;
        }
        pEVar10 = **pppEVar12;
        if (!(bool)(~bVar16 & 1 | pEVar10 == *ref)) {
          pPVar2 = (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner;
          if ((pPVar2->options).trapsNeverHappen == true) {
            EffectAnalyzer::EffectAnalyzer
                      (&local_1b0,&pPVar2->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .currModule,pEVar10);
            sVar3 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if (((local_1b0.branchesOut == false) && (local_1b0.throws_ == false)) &&
               (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0x130));
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0x100));
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0xa8));
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0x78));
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)((long)&local_1b0 + 0x48));
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)((long)&local_1b0 + 0x18));
              if (sVar3 == 0) goto LAB_009e60c0;
            }
            else {
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0x130));
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0x100));
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0xa8));
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)((long)&local_1b0 + 0x78));
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)((long)&local_1b0 + 0x48));
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)((long)&local_1b0 + 0x18));
            }
          }
          bVar4 = false;
          BVar18.wasm = builder.wasm;
          goto LAB_009e611f;
        }
        bVar16 = bVar16 | pEVar10 == *ref;
LAB_009e60c0:
        index = index + 1;
        BVar18.wasm = builder.wasm;
      } while (IVar15 != index);
    }
    bVar4 = true;
LAB_009e611f:
    if (local_1f0.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar4) {
      this_01 = (Type *)&((BVar18.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      HVar8 = wasm::Type::getHeapType(this_01);
      if (((uint)(0x7c < HVar8.id) * 4 + 3 & (uint)HVar8.id) != 0) {
        __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
      }
      this_01->id = HVar8.id;
    }
  }
  pPVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  pMVar13 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
            ).
            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
            .
            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
            .currModule;
  pEVar10 = *ref;
  do {
    pEVar17 = pEVar10;
    local_1b0._0_8_ = pEVar17;
    ppEVar9 = Properties::getImmediateFallthroughPtr
                        ((Expression **)&local_1b0,&pPVar2->options,pMVar13,AllowTeeBrIf);
    pEVar10 = *ppEVar9;
  } while (*ppEVar9 != pEVar17);
  bVar4 = wasm::Type::isNull(&pEVar17->type);
  if (bVar4) {
    pEVar10 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x10,8);
    pEVar10->_id = UnreachableId;
    (pEVar10->type).id = 1;
    pEVar10 = wasm::getDroppedChildrenAndAppend
                        ((Expression *)local_50,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currModule,
                         &((this->
                           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                           ).super_Pass.runner)->options,pEVar10,NoticeParentEffects);
    replaceCurrent(this,pEVar10);
  }
  return bVar4;
}

Assistant:

bool trapOnNull(Expression* curr, Expression*& ref) {
    Builder builder(*getModule());

    if (getPassOptions().trapsNeverHappen) {
      // We can ignore the possibility of the reference being an input, so
      //
      //    (if
      //      (condition)
      //      (null)
      //      (other))
      // =>
      //    (drop
      //      (condition))
      //    (other)
      //
      // That is, we will by assumption not read from the null, so remove that
      // arm.
      //
      // TODO We could recurse here.
      // TODO We could do similar things for casts (rule out an impossible arm).
      // TODO Worth thinking about an 'assume' instrinsic of some form that
      //      annotates knowledge about a value, or another mechanism to allow
      //      that information to be passed around.

      // Note that we must check that the null is actually flowed out, that is,
      // that control flow is not transferred before:
      //
      //    (if
      //      (1)
      //      (block (result null)
      //        (return)
      //      )
      //      (other))
      //
      // The true arm has a bottom type, but in fact it just returns out of the
      // function and the null does not actually flow out. We can only optimize
      // here if a null definitely flows out (as only that would cause a trap).
      auto flowsOutNull = [&](Expression* child) {
        return child->type.isNull() && !effects(child).transfersControlFlow();
      };

      if (auto* iff = ref->dynCast<If>()) {
        if (iff->ifFalse) {
          if (flowsOutNull(iff->ifTrue)) {
            if (ref->type != iff->ifFalse->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifFalse);
            return false;
          }
          if (flowsOutNull(iff->ifFalse)) {
            if (ref->type != iff->ifTrue->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifTrue);
            return false;
          }
        }
      }

      if (auto* select = ref->dynCast<Select>()) {
        // We must check for unreachability explicitly here because a full
        // refinalize only happens at the end. That is, the select may stil be
        // reachable after we turned one child into an unreachable, and we are
        // calling getResultOfFirst which will error on unreachability.
        if (flowsOutNull(select->ifTrue) &&
            select->ifFalse->type != Type::unreachable) {
          ref = builder.makeSequence(
            builder.makeDrop(select->ifTrue),
            getResultOfFirst(select->ifFalse,
                             builder.makeDrop(select->condition)));
          return false;
        }
        if (flowsOutNull(select->ifFalse) &&
            select->ifTrue->type != Type::unreachable) {
          ref = getResultOfFirst(
            select->ifTrue,
            builder.makeSequence(builder.makeDrop(select->ifFalse),
                                 builder.makeDrop(select->condition)));
          return false;
        }
      }
    }

    // A nullable cast can be turned into a non-nullable one:
    //
    //    (struct.get ;; or something else that traps on a null ref
    //      (ref.cast null
    // =>
    //    (struct.get
    //      (ref.cast      ;; now non-nullable
    //
    // Either way we trap here, but refining the type may have benefits later.
    if (ref->type.isNullable()) {
      if (auto* cast = ref->dynCast<RefCast>()) {
        // Note that we must be the last child of the parent, otherwise effects
        // in the middle may need to remain:
        //
        //    (struct.set
        //      (ref.cast null
        //      (call ..
        //
        // The call here must execute before the trap in the struct.set. To
        // avoid that problem, inspect all children after us. If there are no
        // such children, then there is no problem; if there are, see below.
        auto canOptimize = true;
        auto seenRef = false;
        for (auto* child : ChildIterator(curr)) {
          if (child == ref) {
            seenRef = true;
          } else if (seenRef) {
            // This is a child after the reference. Check it for effects. For
            // simplicity, focus on the case of traps-never-happens: if we can
            // assume no trap occurs in the parent, then there must not be a
            // trap in the child either, unless control flow transfers and we
            // might not reach the parent.
            // TODO: handle more cases.
            if (!getPassOptions().trapsNeverHappen ||
                effects(child).transfersControlFlow()) {
              canOptimize = false;
              break;
            }
          }
        }
        if (canOptimize) {
          cast->type = Type(cast->type.getHeapType(), NonNullable);
        }
      }
    }

    auto fallthrough = getFallthrough(ref);

    if (fallthrough->type.isNull()) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, builder.makeUnreachable()));
      return true;
    }
    return false;
  }